

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstructCondense<float>::Read
          (TPZDohrSubstructCondense<float> *this,TPZStream *input,void *context)

{
  map<std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>,_TPZVec<int>_>_>_>
  *this_00;
  TPZDohrSubstructCondense<float> *pTVar1;
  TPZMatRed<float,_TPZFMatrix<float>_> *pTVar2;
  ostream *poVar3;
  long *plVar4;
  mapped_type *vec;
  int iVar5;
  int control;
  int b;
  int a_1;
  int nc;
  int four;
  int three;
  int two;
  int one;
  int a;
  key_type local_64;
  ENumbering local_5c;
  ENumbering local_58;
  int local_54;
  TPZDohrSubstructCondense<float> *local_50;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  int local_34;
  
  (*input->_vptr_TPZStream[0x1d])(input,&local_34,1);
  if (local_34 != 0) {
    pTVar2 = (TPZMatRed<float,_TPZFMatrix<float>_> *)operator_new(800);
    TPZMatRed<float,_TPZFMatrix<float>_>::TPZMatRed(pTVar2);
    TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator=(&this->fMatRedComplete,pTVar2);
    pTVar2 = ((this->fMatRedComplete).fRef)->fPointer;
    (*(pTVar2->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[6])
              (pTVar2,input,0);
  }
  (*input->_vptr_TPZStream[0x1d])(input,&this->fNEquations,1);
  (*input->_vptr_TPZStream[0x1d])(input,&this->fNumInternalEquations,1);
  (*input->_vptr_TPZStream[0x1d])(input,&this->fNumExternalEquations,1);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->fNEquations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->fNumInternalEquations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  plVar4 = (long *)std::ostream::operator<<(poVar3,this->fNumExternalEquations);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  iVar5 = 0;
  TPZStream::Read<int>(input,&this->fCoarseNodes,(void *)0x0);
  poVar3 = ::operator<<((ostream *)&std::cout,&this->fCoarseNodes);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_38 = 0xffffffff;
  local_3c = 0xfffffffe;
  local_40 = 0xfffffffd;
  local_44 = 0xfffffffc;
  (*input->_vptr_TPZStream[0x1d])(input,&local_38,1);
  TPZFMatrix<float>::Read(&this->fPhiC,input,(void *)0x0);
  (*input->_vptr_TPZStream[0x1d])(input,&local_3c,1);
  TPZFMatrix<float>::Read(&this->fPhiC_Weighted_Condensed,input,(void *)0x0);
  (*input->_vptr_TPZStream[0x1d])(input,&local_40,1);
  TPZStream::Read<float>(input,&(this->fWeights).super_TPZVec<float>,(void *)0x0);
  local_50 = this;
  TPZFMatrix<float>::Read(&this->fKCi,input,(void *)0x0);
  (*input->_vptr_TPZStream[0x1d])(input,&local_44,1);
  (*input->_vptr_TPZStream[0x1d])(input,&local_54,1);
  if (0 < local_54) {
    this_00 = &local_50->fPermutationsScatter;
    do {
      (*input->_vptr_TPZStream[0x1d])(input,&local_58,1);
      (*input->_vptr_TPZStream[0x1d])(input,&local_5c,1);
      local_64.first = local_58;
      local_64.second = local_5c;
      vec = std::
            map<std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>,_TPZVec<int>_>_>_>
            ::operator[](this_00,&local_64);
      TPZStream::Read<int>(input,vec,(void *)0x0);
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_54);
  }
  (*input->_vptr_TPZStream[0x1d])(input,&local_64,1);
  pTVar1 = local_50;
  if (local_64.first != Submesh) {
    pTVar2 = (TPZMatRed<float,_TPZFMatrix<float>_> *)operator_new(800);
    TPZMatRed<float,_TPZFMatrix<float>_>::TPZMatRed(pTVar2);
    TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator=(&pTVar1->fMatRed,pTVar2);
    pTVar2 = ((pTVar1->fMatRed).fRef)->fPointer;
    (*(pTVar2->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[6])
              (pTVar2,input,0);
  }
  TPZFMatrix<float>::Read(&pTVar1->fLocalLoad,input,(void *)0x0);
  TPZFMatrix<float>::Read(&pTVar1->fLocalWeightedResidual,input,(void *)0x0);
  TPZFMatrix<float>::Read(&pTVar1->fAdjustSolution,input,(void *)0x0);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Read(TPZStream &input, void *context)
{
    int a;
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&a);
    if (a) {
        fMatRedComplete = new TPZMatRed<TVar, TPZFMatrix<TVar> >;
        fMatRedComplete->Read(input,0);
    }
    
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&fNEquations);
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&fNumInternalEquations);
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&fNumExternalEquations);
    std::cout << fNEquations << " " << fNumInternalEquations << " " << fNumExternalEquations << std::endl;
    input.Read( fCoarseNodes);
    std::cout << fCoarseNodes << std::endl;
    int one(-1),two(-2),three(-3),four(-4);

    input.Read(&one);
    fPhiC.Read(input, 0);
    input.Read(&two);
    fPhiC_Weighted_Condensed.Read(input, 0);
    input.Read(&three);
    input.Read( fWeights);
    fKCi.Read(input, 0);
    input.Read(&four);
    int nc;
    input.Read(&nc);
    for (int ic=0; ic<nc; ic++) {
        int a;
        int b;
        input.Read(&a);
        input.Read(&b);
        ENumbering orig = (ENumbering)(a),dest = (ENumbering)(b);
        std::pair<ENumbering, ENumbering> p(orig,dest);
        input.Read( fPermutationsScatter[p]);
    }
    int control;
    input.Read(&control);
    if(control)
    {
        fMatRed = new TPZMatRed<TVar, TPZFMatrix<TVar> >;
        fMatRed->Read(input, 0);
    }
    fLocalLoad.Read(input, 0);
    fLocalWeightedResidual.Read(input, 0);
    fAdjustSolution.Read(input, 0);
    
    
}